

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O1

void __thiscall helics::BaseTimeCoordinator::disconnect(BaseTimeCoordinator *this)

{
  int iVar1;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  DependencyInfo *dep;
  pointer pDVar5;
  ActionMessage bye;
  ActionMessage multi;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if (this->disconnected == false) {
    if ((this->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this->disconnected = true;
    }
    else {
      ActionMessage::ActionMessage(&local_1a0,cmd_disconnect);
      local_1a0.source_id.gid = (this->mSourceId).gid;
      pDVar5 = (this->dependencies).dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(this->dependencies).dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pDVar5 == 0x58) {
        if (((pDVar5->dependency == true) &&
            ((pDVar5->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff)) ||
           (pDVar5->dependent == true)) {
          local_1a0.dest_id.gid = (pDVar5->fedID).gid;
          if (local_1a0.dest_id.gid == local_1a0.source_id.gid) {
            (*this->_vptr_BaseTimeCoordinator[3])(this,&local_1a0);
          }
          else {
            if ((this->sendMessageFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->sendMessageFunction)._M_invoker)
                      ((_Any_data *)&this->sendMessageFunction,&local_1a0);
          }
        }
      }
      else {
        ActionMessage::ActionMessage(&local_e8,cmd_multi_message);
        pDVar5 = (this->dependencies).dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar2 = (this->dependencies).dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pDVar5 != pDVar2) {
          bVar3 = false;
          do {
            if (((pDVar5->dependency == true) &&
                ((pDVar5->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff)) ||
               (bVar4 = bVar3, pDVar5->dependent == true)) {
              iVar1 = (pDVar5->fedID).gid;
              bVar4 = true;
              if (iVar1 != (this->mSourceId).gid) {
                local_1a0.dest_id.gid = iVar1;
                appendMessage(&local_e8,&local_1a0);
                bVar4 = bVar3;
              }
            }
            pDVar5 = pDVar5 + 1;
            bVar3 = bVar4;
          } while (pDVar5 != pDVar2);
          if (bVar4) {
            local_1a0.dest_id.gid = (this->mSourceId).gid;
            (*this->_vptr_BaseTimeCoordinator[3])(this);
          }
        }
        if ((this->sendMessageFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->sendMessageFunction)._M_invoker)((_Any_data *)&this->sendMessageFunction,&local_e8)
        ;
        ActionMessage::~ActionMessage(&local_e8);
      }
      this->disconnected = true;
      ActionMessage::~ActionMessage(&local_1a0);
    }
  }
  return;
}

Assistant:

void BaseTimeCoordinator::disconnect()
{
    if (disconnected) {
        return;
    }

    if (dependencies.empty()) {
        disconnected = true;
        return;
    }
    ActionMessage bye(CMD_DISCONNECT);
    bye.source_id = mSourceId;
    if (dependencies.size() == 1) {
        auto& dep = *dependencies.begin();
        if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
            bye.dest_id = dep.fedID;
            if (bye.dest_id == mSourceId) {
                processTimeMessage(bye);
            } else {
                sendMessageFunction(bye);
            }
        }

    } else {
        ActionMessage multi(CMD_MULTI_MESSAGE);
        bool hasLocal{false};
        for (const auto& dep : dependencies) {
            if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                if (dep.fedID == mSourceId) {
                    hasLocal = true;
                } else {
                    bye.dest_id = dep.fedID;
                    appendMessage(multi, bye);
                }
            }
        }
        if (hasLocal) {
            bye.dest_id = mSourceId;
            processTimeMessage(bye);
        }
        sendMessageFunction(multi);
    }
    disconnected = true;
}